

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::Rollup::SortAndAggregateRows
          (Rollup *this,RollupRow *row,Rollup *base,Options *options,bool is_toplevel)

{
  string_view format;
  string_view format_00;
  ulong uVar1;
  bool bVar2;
  __type _Var3;
  Options_SortBy OVar4;
  int iVar5;
  size_type sVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar7;
  int64 iVar8;
  ulong uVar9;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
  this_00;
  long in_RDX;
  long in_RSI;
  byte in_R8B;
  double dVar10;
  const_iterator it_2;
  const_iterator it_1;
  Rollup *child_base;
  Rollup *child_rollup;
  RollupRow *child_row_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *__range1_2;
  RollupRow *child_row;
  iterator __end2;
  iterator __begin2;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *__range2;
  RollupRow *child_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *__range1_1;
  const_iterator it;
  size_t i;
  Rollup others_base;
  Rollup others_rollup;
  RollupRow others_row;
  RollupRow *child;
  iterator __end1;
  iterator __begin1;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *__range1;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *child_rows;
  Rollup *in_stack_fffffffffffffbd8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
  in_stack_fffffffffffffbe0;
  value_type *in_stack_fffffffffffffbe8;
  Arg *in_stack_fffffffffffffbf0;
  __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  in_stack_fffffffffffffbf8;
  __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  in_stack_fffffffffffffc00;
  Arg *in_stack_fffffffffffffc08;
  long in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  Options_SortBy in_stack_fffffffffffffc1c;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *in_stack_fffffffffffffc30;
  iterator in_stack_fffffffffffffc38;
  Rollup *in_stack_fffffffffffffc40;
  RollupRow *in_stack_fffffffffffffc48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
  in_stack_fffffffffffffc50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
  local_360;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
  local_358;
  undefined1 local_350 [96];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
  local_2f0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
  local_2e8;
  Rollup *local_2e0;
  pointer local_2d8;
  reference local_2d0;
  RollupRow *local_2c8;
  __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  local_2c0;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *local_2b8;
  reference local_2b0;
  RollupRow *local_2a8;
  __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  local_2a0;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *local_298;
  RollupRow *local_290;
  RollupRow *local_288;
  reference local_280;
  RollupRow *local_278;
  __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  local_270;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *local_268;
  RollupRow *local_260;
  RollupRow *local_258;
  RollupRow *local_250;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
  local_240;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
  local_238;
  ulong local_230;
  undefined1 local_228 [96];
  Rollup local_1c8;
  string local_128 [48];
  string local_f8 [40];
  int local_d0;
  long local_b8;
  RollupRow *local_70;
  RollupRow *local_68;
  long local_60;
  long local_58;
  reference local_50;
  RollupRow *local_48;
  __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  local_40;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *local_38;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *local_30;
  byte local_21;
  long local_18;
  long local_10;
  
  local_21 = in_R8B & 1;
  local_30 = (vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)(in_RSI + 0x70);
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((local_21 == 0) &&
     (sVar6 = std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::size(local_30),
     sVar6 == 1)) {
    std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::operator[](local_30,0);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffbe0._M_cur,(char *)in_stack_fffffffffffffbd8);
    if (!bVar2) {
      std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::operator[](local_30,0);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffbe0._M_cur,(char *)in_stack_fffffffffffffbd8);
      if (!bVar2) goto LAB_00184e6b;
    }
    std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::clear
              ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)0x184e6b);
  }
LAB_00184e6b:
  sVar6 = std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::size(local_30);
  if (sVar6 == 1) {
    std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::operator[](local_30,0);
    _Var3 = std::operator==(&(in_stack_fffffffffffffc00._M_current)->name,
                            &(in_stack_fffffffffffffbf8._M_current)->name);
    if (_Var3) {
      std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::clear
                ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)0x184eb2);
    }
  }
  bVar2 = std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::empty
                    ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                     in_stack_fffffffffffffbf0);
  if (!bVar2) {
    local_38 = local_30;
    local_40._M_current =
         (RollupRow *)
         std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::begin
                   ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                    in_stack_fffffffffffffbd8);
    local_48 = (RollupRow *)
               std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::end
                         ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                          in_stack_fffffffffffffbd8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                               *)in_stack_fffffffffffffbe0._M_cur,
                              (__normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                               *)in_stack_fffffffffffffbd8), bVar2) {
      local_50 = __gnu_cxx::
                 __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                 ::operator*(&local_40);
      OVar4 = Options::sort_by((Options *)0x184f44);
      if (OVar4 == Options_SortBy_SORTBY_BOTH) {
        iVar5 = std::abs((int)(local_50->size).vm);
        local_58 = CONCAT44(extraout_var_01,iVar5);
        iVar5 = std::abs((int)(local_50->size).file);
        local_60 = CONCAT44(extraout_var_02,iVar5);
        plVar7 = std::max<long>(&local_58,&local_60);
        local_50->sortkey = *plVar7;
      }
      else if (OVar4 == Options_SortBy_SORTBY_VMSIZE) {
        iVar5 = std::abs((int)(local_50->size).vm);
        local_50->sortkey = CONCAT44(extraout_var,iVar5);
      }
      else {
        if (OVar4 != Options_SortBy_SORTBY_FILESIZE) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc"
                        ,0x1e3,
                        "void bloaty::Rollup::SortAndAggregateRows(RollupRow *, const Rollup *, const Options &, bool) const"
                       );
        }
        iVar5 = std::abs((int)(local_50->size).file);
        local_50->sortkey = CONCAT44(extraout_var_00,iVar5);
      }
      __gnu_cxx::
      __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
      ::operator++(&local_40);
    }
    local_68 = (RollupRow *)
               std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::begin
                         ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                          in_stack_fffffffffffffbd8);
    local_70 = (RollupRow *)
               std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::end
                         ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                          in_stack_fffffffffffffbd8);
    std::
    sort<__gnu_cxx::__normal_iterator<bloaty::RollupRow*,std::vector<bloaty::RollupRow,std::allocator<bloaty::RollupRow>>>,bool(*)(bloaty::RollupRow_const&,bloaty::RollupRow_const&)>
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
               (_func_bool_RollupRow_ptr_RollupRow_ptr *)in_stack_fffffffffffffbf0);
    RollupRow::RollupRow
              ((RollupRow *)in_stack_fffffffffffffbe0._M_cur,(string *)in_stack_fffffffffffffbd8);
    sVar6 = std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::size(local_30);
    iVar8 = Options::max_rows_per_level((Options *)0x1850c2);
    local_b8 = sVar6 - iVar8;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&in_stack_fffffffffffffbf0->piece_,(char *)in_stack_fffffffffffffbe8);
    absl::substitute_internal::Arg::Arg(in_stack_fffffffffffffbf0,(long)in_stack_fffffffffffffbe8);
    format._M_str._0_4_ = in_stack_fffffffffffffc18;
    format._M_len = in_stack_fffffffffffffc10;
    format._M_str._4_4_ = in_stack_fffffffffffffc1c;
    absl::Substitute_abi_cxx11_(format,in_stack_fffffffffffffc08);
    std::__cxx11::string::operator=(local_f8,local_128);
    std::__cxx11::string::~string(local_128);
    Rollup((Rollup *)0x185170);
    Rollup((Rollup *)0x18517f);
    local_230 = std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::size(local_30);
    while( true ) {
      local_230 = local_230 - 1;
      uVar1 = local_230;
      uVar9 = Options::max_rows_per_level((Options *)0x1851b7);
      if (uVar1 < uVar9) break;
      std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::operator[]
                (local_30,local_230);
      CheckedAdd((int64_t *)in_stack_fffffffffffffbe0._M_cur,(int64_t)in_stack_fffffffffffffbd8);
      std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::operator[]
                (local_30,local_230);
      CheckedAdd((int64_t *)in_stack_fffffffffffffbe0._M_cur,(int64_t)in_stack_fffffffffffffbd8);
      if (local_18 != 0) {
        in_stack_fffffffffffffc48 = (RollupRow *)(local_18 + 0x28);
        std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::operator[]
                  (local_30,local_230);
        in_stack_fffffffffffffc50._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
                     *)in_stack_fffffffffffffbd8,(key_type *)0x18528c);
        local_238._M_cur = in_stack_fffffffffffffc50._M_cur;
        local_240._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
                    *)in_stack_fffffffffffffbd8);
        bVar2 = std::__detail::operator!=(&local_238,&local_240);
        if (bVar2) {
          std::__detail::
          _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_false,_true>
          ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_false,_true>
                        *)0x1852e4);
          std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>::operator->
                    ((unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_> *)0x1852f0);
          CheckedAdd((int64_t *)in_stack_fffffffffffffbe0._M_cur,(int64_t)in_stack_fffffffffffffbd8)
          ;
          in_stack_fffffffffffffc40 = (Rollup *)(local_228 + 8);
          std::__detail::
          _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_false,_true>
          ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_false,_true>
                        *)0x18531c);
          std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>::operator->
                    ((unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_> *)0x185328);
          CheckedAdd((int64_t *)in_stack_fffffffffffffbe0._M_cur,(int64_t)in_stack_fffffffffffffbd8)
          ;
        }
      }
      in_stack_fffffffffffffc30 = local_30;
      local_258 = (RollupRow *)
                  std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::end
                            ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                             in_stack_fffffffffffffbd8);
      local_250 = (RollupRow *)
                  __gnu_cxx::
                  __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                  ::operator-((__normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                               *)in_stack_fffffffffffffbe8,
                              (difference_type)in_stack_fffffffffffffbe0._M_cur);
      __gnu_cxx::
      __normal_iterator<bloaty::RollupRow_const*,std::vector<bloaty::RollupRow,std::allocator<bloaty::RollupRow>>>
      ::__normal_iterator<bloaty::RollupRow*>
                ((__normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                  *)in_stack_fffffffffffffbe0._M_cur,
                 (__normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                  *)in_stack_fffffffffffffbd8);
      in_stack_fffffffffffffc38 =
           std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::erase
                     ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                      in_stack_fffffffffffffbf0,in_stack_fffffffffffffbf8._M_current);
      local_260 = in_stack_fffffffffffffc38._M_current;
    }
    iVar5 = std::abs((int)local_f8._32_8_);
    if ((0 < CONCAT44(extraout_var_03,iVar5)) ||
       (iVar5 = std::abs(local_d0), 0 < CONCAT44(extraout_var_04,iVar5))) {
      std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::push_back
                ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                 in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      CheckedAdd((int64_t *)in_stack_fffffffffffffbe0._M_cur,(int64_t)in_stack_fffffffffffffbd8);
      CheckedAdd((int64_t *)in_stack_fffffffffffffbe0._M_cur,(int64_t)in_stack_fffffffffffffbd8);
    }
    local_268 = local_30;
    local_270._M_current =
         (RollupRow *)
         std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::begin
                   ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                    in_stack_fffffffffffffbd8);
    local_278 = (RollupRow *)
                std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::end
                          ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                           in_stack_fffffffffffffbd8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                               *)in_stack_fffffffffffffbe0._M_cur,
                              (__normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                               *)in_stack_fffffffffffffbd8), bVar2) {
      local_280 = __gnu_cxx::
                  __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                  ::operator*(&local_270);
      in_stack_fffffffffffffc1c = Options::sort_by((Options *)0x18550e);
      if (in_stack_fffffffffffffc1c == Options_SortBy_SORTBY_BOTH) {
        iVar5 = std::abs((int)(local_280->size).vm);
        in_stack_fffffffffffffc10 = CONCAT44(extraout_var_05,iVar5);
        iVar5 = std::abs((int)(local_280->size).file);
        in_stack_fffffffffffffc08 = (Arg *)CONCAT44(extraout_var_06,iVar5);
        if ((long)in_stack_fffffffffffffc08 < in_stack_fffffffffffffc10) {
          local_280->sortkey = (local_280->size).vm;
        }
        else {
          local_280->sortkey = (local_280->size).file;
        }
      }
      else if (in_stack_fffffffffffffc1c == Options_SortBy_SORTBY_VMSIZE) {
        local_280->sortkey = (local_280->size).vm;
      }
      else {
        if (in_stack_fffffffffffffc1c != Options_SortBy_SORTBY_FILESIZE) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc"
                        ,0x218,
                        "void bloaty::Rollup::SortAndAggregateRows(RollupRow *, const Rollup *, const Options &, bool) const"
                       );
        }
        local_280->sortkey = (local_280->size).file;
      }
      __gnu_cxx::
      __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
      ::operator++(&local_270);
    }
    local_288 = (RollupRow *)
                std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::begin
                          ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                           in_stack_fffffffffffffbd8);
    local_290 = (RollupRow *)
                std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::end
                          ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                           in_stack_fffffffffffffbd8);
    std::
    sort<__gnu_cxx::__normal_iterator<bloaty::RollupRow*,std::vector<bloaty::RollupRow,std::allocator<bloaty::RollupRow>>>,bool(*)(bloaty::RollupRow_const&,bloaty::RollupRow_const&)>
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
               (_func_bool_RollupRow_ptr_RollupRow_ptr *)in_stack_fffffffffffffbf0);
    if (local_18 == 0) {
      local_298 = local_30;
      local_2a0._M_current =
           (RollupRow *)
           std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::begin
                     ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                      in_stack_fffffffffffffbd8);
      local_2a8 = (RollupRow *)
                  std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::end
                            ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                             in_stack_fffffffffffffbd8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                                 *)in_stack_fffffffffffffbe0._M_cur,
                                (__normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                                 *)in_stack_fffffffffffffbd8), bVar2) {
        local_2b0 = __gnu_cxx::
                    __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                    ::operator*(&local_2a0);
        dVar10 = Percent((local_2b0->size).vm,*(int64_t *)(local_10 + 0x20));
        local_2b0->vmpercent = dVar10;
        dVar10 = Percent((local_2b0->size).file,*(int64_t *)(local_10 + 0x28));
        local_2b0->filepercent = dVar10;
        __gnu_cxx::
        __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
        ::operator++(&local_2a0);
      }
    }
    local_2b8 = local_30;
    local_2c0._M_current =
         (RollupRow *)
         std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::begin
                   ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                    in_stack_fffffffffffffbd8);
    local_2c8 = (RollupRow *)
                std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::end
                          ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                           in_stack_fffffffffffffbd8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                               *)in_stack_fffffffffffffbe0._M_cur,
                              (__normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                               *)in_stack_fffffffffffffbd8), bVar2) {
      local_2d0 = __gnu_cxx::
                  __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                  ::operator*(&local_2c0);
      local_2e0 = (Rollup *)0x0;
      if (local_2d0->other_count < 1) {
        this_00._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
                     *)in_stack_fffffffffffffbd8,(key_type *)0x185832);
        local_2e8._M_cur = this_00._M_cur;
        local_2f0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
                    *)in_stack_fffffffffffffbd8);
        bVar2 = std::__detail::operator==(&local_2e8,&local_2f0);
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)this_00._M_cur,
                     (char *)in_stack_fffffffffffffbe8);
          iVar5 = (int)((ulong)local_350 >> 0x20);
          absl::substitute_internal::Arg::Arg<std::allocator<char>>
                    ((Arg *)in_stack_fffffffffffffbe0._M_cur,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffbd8);
          format_00._M_str._0_4_ = in_stack_fffffffffffffc18;
          format_00._M_len = in_stack_fffffffffffffc10;
          format_00._M_str._4_4_ = in_stack_fffffffffffffc1c;
          absl::Substitute_abi_cxx11_(format_00,in_stack_fffffffffffffc08);
          std::__cxx11::string::c_str();
          Throw((char *)this_00._M_cur,iVar5);
        }
        std::__detail::
        _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_false,_true>
        ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_false,_true>
                      *)0x18591e);
        local_2d8 = std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>::get
                              ((unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_> *)
                               in_stack_fffffffffffffbe0._M_cur);
        if (local_2d8 == (pointer)0x0) {
          __assert_fail("child_rollup",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc"
                        ,0x236,
                        "void bloaty::Rollup::SortAndAggregateRows(RollupRow *, const Rollup *, const Options &, bool) const"
                       );
        }
        if (local_18 != 0) {
          in_stack_fffffffffffffbe0._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
               ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
                       *)in_stack_fffffffffffffbd8,(key_type *)0x185986);
          local_358._M_cur = in_stack_fffffffffffffbe0._M_cur;
          local_360._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
                      *)in_stack_fffffffffffffbd8);
          bVar2 = std::__detail::operator==(&local_358,&local_360);
          if (bVar2) {
            in_stack_fffffffffffffbd8 = GetEmpty();
            local_2e0 = in_stack_fffffffffffffbd8;
          }
          else {
            std::__detail::
            _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_false,_true>
            ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_false,_true>
                          *)0x1859f4);
            local_2e0 = std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>::get
                                  ((unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>
                                    *)in_stack_fffffffffffffbe0._M_cur);
          }
        }
      }
      else {
        local_2d8 = &local_1c8;
        if (local_18 != 0) {
          local_2e0 = (Rollup *)local_228;
        }
      }
      CreateRows((Rollup *)in_stack_fffffffffffffc50._M_cur,in_stack_fffffffffffffc48,
                 in_stack_fffffffffffffc40,(Options *)in_stack_fffffffffffffc38._M_current,
                 SUB81((ulong)in_stack_fffffffffffffc30 >> 0x38,0));
      __gnu_cxx::
      __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
      ::operator++(&local_2c0);
    }
    ~Rollup((Rollup *)0x185a57);
    ~Rollup((Rollup *)0x185a64);
    RollupRow::~RollupRow((RollupRow *)in_stack_fffffffffffffbe0._M_cur);
  }
  return;
}

Assistant:

void Rollup::SortAndAggregateRows(RollupRow* row, const Rollup* base,
                                  const Options& options,
                                  bool is_toplevel) const {
  std::vector<RollupRow>& child_rows = row->sorted_children;

  // We don't want to output a solitary "[None]" or "[Unmapped]" row except at
  // the top level.
  if (!is_toplevel && child_rows.size() == 1 &&
      (child_rows[0].name == "[None]" || child_rows[0].name == "[Unmapped]")) {
    child_rows.clear();
  }

  // We don't want to output a single row that has exactly the same size and
  // label as the parent.
  if (child_rows.size() == 1 && child_rows[0].name == row->name) {
    child_rows.clear();
  }

  if (child_rows.empty()) {
    return;
  }

  // First sort by magnitude.
  for (auto& child : child_rows) {
    switch (options.sort_by()) {
      case Options::SORTBY_VMSIZE:
        child.sortkey = std::abs(child.size.vm);
        break;
      case Options::SORTBY_FILESIZE:
        child.sortkey = std::abs(child.size.file);
        break;
      case Options::SORTBY_BOTH:
        child.sortkey =
            std::max(std::abs(child.size.vm), std::abs(child.size.file));
        break;
      default:
        BLOATY_UNREACHABLE();
    }
  }

  std::sort(child_rows.begin(), child_rows.end(), &RollupRow::Compare);

  RollupRow others_row(others_label);
  others_row.other_count = child_rows.size() - options.max_rows_per_level();
  others_row.name = absl::Substitute("[$0 Others]", others_row.other_count);
  Rollup others_rollup;
  Rollup others_base;

  // Filter out everything but the top 'row_limit'.  Add rows that were filtered
  // out to "others_row".
  size_t i = child_rows.size() - 1;
  while (i >= options.max_rows_per_level()) {
    CheckedAdd(&others_row.size.vm, child_rows[i].size.vm);
    CheckedAdd(&others_row.size.file, child_rows[i].size.file);
    if (base) {
      auto it = base->children_.find(child_rows[i].name);
      if (it != base->children_.end()) {
        CheckedAdd(&others_base.vm_total_, it->second->vm_total_);
        CheckedAdd(&others_base.file_total_, it->second->file_total_);
      }
    }

    child_rows.erase(child_rows.end() - 1);
    i--;
  }

  if (std::abs(others_row.size.vm) > 0 || std::abs(others_row.size.file) > 0) {
    child_rows.push_back(others_row);
    CheckedAdd(&others_rollup.vm_total_, others_row.size.vm);
    CheckedAdd(&others_rollup.file_total_, others_row.size.file);
  }

  // Now sort by actual value (positive or negative).
  for (auto& child : child_rows) {
    switch (options.sort_by()) {
      case Options::SORTBY_VMSIZE:
        child.sortkey = child.size.vm;
        break;
      case Options::SORTBY_FILESIZE:
        child.sortkey = child.size.file;
        break;
      case Options::SORTBY_BOTH:
        if (std::abs(child.size.vm) > std::abs(child.size.file)) {
          child.sortkey = child.size.vm;
        } else {
          child.sortkey = child.size.file;
        }
        break;
      default:
        BLOATY_UNREACHABLE();
    }
  }

  std::sort(child_rows.begin(), child_rows.end(), &RollupRow::Compare);

  // For a non-diff, the percentage is compared to the total size of the parent.
  if (!base) {
    for (auto& child_row : child_rows) {
      child_row.vmpercent = Percent(child_row.size.vm, row->size.vm);
      child_row.filepercent = Percent(child_row.size.file, row->size.file);
    }
  }

  // Recurse into sub-rows, (except "Other", which isn't a real row).
  for (auto& child_row : child_rows) {
    const Rollup* child_rollup;
    const Rollup* child_base = nullptr;

    if (child_row.other_count > 0) {
      child_rollup = &others_rollup;
      if (base) {
        child_base = &others_base;
      }
    } else {
      auto it = children_.find(child_row.name);
      if (it == children_.end()) {
        THROWF("internal error, couldn't find name $0", child_row.name);
      }
      child_rollup = it->second.get();
      assert(child_rollup);

      if (base) {
        auto it = base->children_.find(child_row.name);
        if (it == base->children_.end()) {
          child_base = GetEmpty();
        } else {
          child_base = it->second.get();
        }
      }
    }

    child_rollup->CreateRows(&child_row, child_base, options, false);
  }
}